

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

void __thiscall tcu::DebugOutStreambuf::DebugOutStreambuf(DebugOutStreambuf *this)

{
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__DebugOutStreambuf_01e74510;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_curLine);
  return;
}

Assistant:

DebugOutStreambuf::DebugOutStreambuf (void)
{
}